

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tree.cpp
# Opt level: O0

void __thiscall SaiTreeView::PrintVirtualFileEntry(SaiTreeView *this,VirtualFileEntry *Entry)

{
  tm *__tp;
  size_t sVar1;
  char *pcVar2;
  char local_48 [8];
  char TimeString [32];
  time_t local_20;
  time_t TimeStamp;
  VirtualFileEntry *Entry_local;
  SaiTreeView *this_local;
  
  TimeStamp = (time_t)Entry;
  Entry_local = (VirtualFileEntry *)this;
  local_20 = sai::VirtualFileEntry::GetTimeStamp(Entry);
  __tp = localtime(&local_20);
  strftime(local_48,0x20,"%D %R",__tp);
  PrintNestedFolder(this);
  sVar1 = sai::VirtualFileEntry::GetSize((VirtualFileEntry *)TimeStamp);
  pcVar2 = sai::VirtualFileEntry::GetName((VirtualFileEntry *)TimeStamp);
  printf(anon_var_dwarf_3954,sVar1,local_48,pcVar2);
  return;
}

Assistant:

void PrintVirtualFileEntry(const sai::VirtualFileEntry& Entry) const
	{
		const std::time_t TimeStamp = Entry.GetTimeStamp();
		char              TimeString[32];
		std::strftime(TimeString, 32, "%D %R", std::localtime(&TimeStamp));
		PrintNestedFolder();
		std::printf(
			"\u251C\u2500\u2500 [%12zu %s] %s\n", Entry.GetSize(), TimeString, Entry.GetName()
		);
	}